

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O3

Token * __thiscall inja::Lexer::scan_number(Token *__return_storage_ptr__,Lexer *this)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  
  uVar1 = (this->m_in)._M_len;
  pcVar2 = (this->m_in)._M_str;
  uVar4 = this->pos;
  uVar5 = uVar4;
  if (uVar4 < uVar1) {
    do {
      bVar6 = pcVar2[uVar4];
      if (9 < (int)(char)bVar6 - 0x30U) {
        uVar5 = uVar4;
        if (bVar6 < 0x2e) {
          if ((bVar6 != 0x2b) && (bVar6 != 0x2d)) break;
          if (uVar4 != 0) {
            bVar6 = pcVar2[uVar4 - 1] | 0x20;
            goto LAB_0012d51f;
          }
        }
        else if ((bVar6 != 0x2e) && (bVar6 != 0x45)) {
LAB_0012d51f:
          if (bVar6 != 0x65) break;
        }
      }
      uVar4 = uVar4 + 1;
      this->pos = uVar4;
      uVar5 = uVar1;
    } while (uVar1 != uVar4);
  }
  uVar4 = this->tok_start;
  if (uVar1 < this->tok_start) {
    uVar4 = uVar1;
  }
  if (uVar5 < uVar4) {
    uVar5 = uVar4;
  }
  if (uVar1 <= uVar5) {
    uVar5 = uVar1;
  }
  uVar3 = uVar1 - uVar4;
  if (uVar5 - uVar4 <= uVar1 - uVar4) {
    uVar3 = uVar5 - uVar4;
  }
  __return_storage_ptr__->kind = Number;
  (__return_storage_ptr__->text)._M_len = uVar3;
  (__return_storage_ptr__->text)._M_str = pcVar2 + uVar4;
  return __return_storage_ptr__;
}

Assistant:

Token scan_number() {
    for (;;) {
      if (pos >= m_in.size()) {
        break;
      }
      const char ch = m_in[pos];
      // be very permissive in lexer (we'll catch errors when conversion happens)
      if (!(std::isdigit(ch) || ch == '.' || ch == 'e' || ch == 'E' || (ch == '+' && (pos == 0 || m_in[pos-1] == 'e' || m_in[pos-1] == 'E')) || (ch == '-' && (pos == 0 || m_in[pos-1] == 'e' || m_in[pos-1] == 'E')))) {
        break;
      }
      pos += 1;
    }
    return make_token(Token::Kind::Number);
  }